

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.h
# Opt level: O2

void __thiscall
TTD::ThreadContextTTD::AddLocalRoot
          (ThreadContextTTD *this,TTD_LOG_PTR_ID origId,RecyclableObject *newRoot)

{
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  TTD_LOG_PTR_ID local_30;
  TTD_LOG_PTR_ID origId_local;
  RecyclableObject *newRoot_local;
  
  local_30 = origId;
  origId_local = (TTD_LOG_PTR_ID)newRoot;
  this_00 = Memory::
            RecyclerRootPtr<JsUtil::BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
            ::operator->(&this->m_ttdReplayRootPinSet);
  JsUtil::
  BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::AddNew(this_00,(RecyclableObject **)&origId_local);
  JsUtil::
  BaseDictionary<unsigned_long,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<unsigned_long,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<unsigned_long,Js::RecyclableObject*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)&this->m_ttdRootTagToObjectMap,&local_30,(RecyclableObject **)&origId_local);
  return;
}

Assistant:

void AddLocalRoot(TTD_LOG_PTR_ID origId, Js::RecyclableObject* newRoot)
        {
            this->m_ttdReplayRootPinSet->AddNew(newRoot);
            this->m_ttdRootTagToObjectMap.Item(origId, newRoot);
        }